

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void cppurses::detail::Screen::delegate_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  Glyph *rhs;
  byte *pbVar1;
  bool bVar2;
  long lVar3;
  byte local_3b [3];
  Glyph local_38;
  
  rhs = &(widg->screen_state_).optimize.wallpaper;
  Widget::generate_wallpaper(&local_38,widg);
  if ((widg->screen_state_).optimize.just_enabled == false) {
    bVar2 = operator==(&local_38,rhs);
    if (bVar2) {
LAB_00163efe:
      if (((widg->screen_state_).optimize.moved != true) &&
         ((widg->screen_state_).optimize.resized == false)) {
        if ((widg->screen_state_).optimize.child_event == true) {
          paint_child_event(widg,staged_tiles);
        }
        else {
          basic_paint(widg,staged_tiles);
        }
        goto LAB_00163fde;
      }
    }
    else if ((local_38.symbol == L' ') && (rhs->symbol == L' ')) {
      local_3b[0] = 2;
      local_3b[1] = 3;
      local_3b[2] = 5;
      lVar3 = 0;
      do {
        if (lVar3 == 3) {
          bVar2 = (widg->screen_state_).optimize.wallpaper.brush.background_color_.initialized_;
          if (local_38.brush.background_color_.initialized_ == false) {
            if (bVar2 == false) goto LAB_00163efe;
          }
          else if ((bVar2 != false) &&
                  (*&(widg->screen_state_).optimize.wallpaper.brush.background_color_.storage_.data_
                   == local_38.brush.background_color_.storage_.data_)) goto LAB_00163efe;
          break;
        }
        pbVar1 = local_3b + lVar3;
        lVar3 = lVar3 + 1;
      } while ((((widg->screen_state_).optimize.wallpaper.brush.attributes_.super__Base_bitset<1UL>.
                 _M_w >> (*pbVar1 & 0x3f) & 1) != 0) !=
               (((ulong)local_38.brush.attributes_.super__Base_bitset<1UL>._M_w >> (*pbVar1 & 0x3f)
                & 1) != 0));
    }
  }
  full_paint(widg,staged_tiles);
LAB_00163fde:
  Screen_state::Optimize::reset(&(widg->screen_state_).optimize);
  Glyph::operator=(rhs,&local_38);
  return;
}

Assistant:

void Screen::delegate_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    auto& optimization_info       = widg.screen_state().optimize;
    auto& previous_wallpaper      = optimization_info.wallpaper;
    const auto& current_wallpaper = widg.generate_wallpaper();
    if (optimization_info.just_enabled) {
        paint_just_enabled(widg, staged_tiles);
    }
    else if (!has_same_display(current_wallpaper, previous_wallpaper)) {
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.moved) {
        paint_move_event(widg, staged_tiles);
    }
    else if (optimization_info.resized) {
        // paint_resize_event(widg, staged_tiles);
        full_paint(widg, staged_tiles);
    }
    else if (optimization_info.child_event) {
        paint_child_event(widg, staged_tiles);
    }
    else {
        basic_paint(widg, staged_tiles);
    }
    optimization_info.reset();
    previous_wallpaper = current_wallpaper;
}